

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O0

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this,string *name,
          bool param_2,cmake *cm)

{
  bool bVar1;
  undefined7 in_register_00000011;
  unique_ptr<cmGlobalUnixMakefileGenerator3,_std::default_delete<cmGlobalUnixMakefileGenerator3>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  cmake *cm_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_20;
  bool param_2_local;
  string *name_local;
  cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this_local;
  
  cm_local._7_1_ = (byte)cm & 1;
  pbStack_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000011,param_2);
  name_local = name;
  this_local = this;
  cmGlobalUnixMakefileGenerator3::GetActualName_abi_cxx11_();
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT71(in_register_00000011,param_2),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
    unique_ptr<std::default_delete<cmGlobalGenerator>,void>
              ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)this);
  }
  else {
    std::make_unique<cmGlobalUnixMakefileGenerator3,cmake*&>((cmake **)&local_58);
    std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
    unique_ptr<cmGlobalUnixMakefileGenerator3,std::default_delete<cmGlobalUnixMakefileGenerator3>,void>
              ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)this,
               &local_58);
    std::
    unique_ptr<cmGlobalUnixMakefileGenerator3,_std::default_delete<cmGlobalUnixMakefileGenerator3>_>
    ::~unique_ptr(&local_58);
  }
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> CreateGlobalGenerator(
    const std::string& name, bool /*allowArch*/, cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return std::unique_ptr<cmGlobalGenerator>();
    }
    return std::unique_ptr<cmGlobalGenerator>(cm::make_unique<T>(cm));
  }